

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_union_inplace(run_container_t *src_1,run_container_t *src_2)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  int min;
  rle16_t *prVar4;
  rle16_t local_4c;
  rle16_t newrl;
  rle16_t local_40;
  int local_3c;
  rle16_t previousrle;
  int32_t xrlepos;
  int32_t rlepos;
  int32_t input1nruns;
  rle16_t *inputsrc1;
  int32_t neededcapacity;
  int32_t maxoutput;
  _Bool if2;
  _Bool if1;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var1 = run_container_is_full(src_1);
  _Var2 = run_container_is_full(src_2);
  if ((_Var1) || (_Var2)) {
    if (_Var1) {
      return;
    }
    if (_Var2) {
      run_container_copy(src_2,src_1);
      return;
    }
  }
  iVar3 = src_1->n_runs + src_2->n_runs;
  min = iVar3 + src_1->n_runs;
  if (src_1->capacity < min) {
    run_container_grow(src_1,min,true);
  }
  memmove(src_1->runs + iVar3,src_1->runs,(long)src_1->n_runs << 2);
  prVar4 = src_1->runs + iVar3;
  iVar3 = src_1->n_runs;
  src_1->n_runs = 0;
  previousrle.value = 0;
  previousrle.length = 0;
  local_3c = 0;
  if (src_2->runs->value < prVar4->value) {
    local_40 = run_container_append_first(src_1,*src_2->runs);
    local_3c = local_3c + 1;
  }
  else {
    local_40 = run_container_append_first(src_1,*prVar4);
    previousrle = (rle16_t)((int)previousrle + 1);
  }
  while (local_3c < src_2->n_runs && (int)previousrle < iVar3) {
    if (src_2->runs[local_3c].value < prVar4[(int)previousrle].value) {
      local_4c = src_2->runs[local_3c];
      local_3c = local_3c + 1;
    }
    else {
      local_4c = prVar4[(int)previousrle];
      previousrle = (rle16_t)((int)previousrle + 1);
    }
    run_container_append(src_1,local_4c,&local_40);
  }
  for (; local_3c < src_2->n_runs; local_3c = local_3c + 1) {
    run_container_append(src_1,src_2->runs[local_3c],&local_40);
  }
  for (; (int)previousrle < iVar3; previousrle = (rle16_t)((int)previousrle + 1)) {
    run_container_append(src_1,prVar4[(int)previousrle],&local_40);
  }
  return;
}

Assistant:

void run_container_union_inplace(run_container_t *src_1,
                                 const run_container_t *src_2) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return;
        }
        if (if2) {
            run_container_copy(src_2, src_1);
            return;
        }
    }
    // we move the data to the end of the current array
    const int32_t maxoutput = src_1->n_runs + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_1->n_runs;
    if (src_1->capacity < neededcapacity)
        run_container_grow(src_1, neededcapacity, true);
    memmove(src_1->runs + maxoutput, src_1->runs,
            src_1->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc1 = src_1->runs + maxoutput;
    const int32_t input1nruns = src_1->n_runs;
    src_1->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(src_1, inputsrc1[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(src_1, src_2->runs[xrlepos]);
        xrlepos++;
    }
    while ((xrlepos < src_2->n_runs) && (rlepos < input1nruns)) {
        rle16_t newrl;
        if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = inputsrc1[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(src_1, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(src_1, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < input1nruns) {
        run_container_append(src_1, inputsrc1[rlepos], &previousrle);
        rlepos++;
    }
}